

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall PlanTestPoolsWithDepthTwo::Run(PlanTestPoolsWithDepthTwo *this)

{
  Plan *pPVar1;
  pointer pcVar2;
  Test *pTVar3;
  bool bVar4;
  long *plVar5;
  Node *pNVar6;
  long lVar7;
  Edge *pEVar8;
  Edge *pEVar9;
  size_type *psVar10;
  long *plVar11;
  Edge **ppEVar12;
  _Elt_pointer ppEVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  _Map_pointer pppEVar18;
  long lVar19;
  _Elt_pointer ppEVar20;
  ulong uVar21;
  string err;
  deque<Edge_*,_std::allocator<Edge_*>_> edges;
  string base_name;
  string local_110;
  Plan *local_f0;
  undefined1 local_e8 [32];
  _Elt_pointer local_c8;
  _Map_pointer pppEStack_c0;
  _Elt_pointer local_b8;
  _Elt_pointer ppEStack_b0;
  _Elt_pointer local_a8;
  _Map_pointer pppEStack_a0;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  size_t local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar17 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_PlanTest).super_StateTestWithBuiltinRules.state_,
              "pool foobar\n  depth = 2\npool bazbin\n  depth = 2\nrule foocat\n  command = cat $in > $out\n  pool = foobar\nrule bazcat\n  command = cat $in > $out\n  pool = bazbin\nbuild out1: foocat in\nbuild out2: foocat in\nbuild out3: foocat in\nbuild outb1: bazcat in\nbuild outb2: bazcat in\nbuild outb3: bazcat in\n  pool =\nbuild allTheThings: cat out1 out2 out3 outb1 outb2 outb3\n"
              ,(ManifestParserOptions)0x0);
  if (iVar17 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  pcVar2 = local_e8 + 0x10;
  iVar17 = -3;
  do {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_110,'\x01');
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x1a2a7f);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar10) {
      local_e8._16_8_ = *psVar10;
      local_e8._24_8_ = plVar5[3];
      local_e8._0_8_ = pcVar2;
    }
    else {
      local_e8._16_8_ = *psVar10;
      local_e8._0_8_ = (size_type *)*plVar5;
    }
    local_e8._8_8_ = plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pNVar6 = StateTestWithBuiltinRules::GetNode
                       ((StateTestWithBuiltinRules *)this,(string *)local_e8);
    pNVar6->dirty_ = true;
    if ((pointer)local_e8._0_8_ != pcVar2) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_110,'\x01');
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x193e50);
    plVar11 = plVar5 + 2;
    if ((long *)*plVar5 == plVar11) {
      local_e8._16_8_ = *plVar11;
      local_e8._24_8_ = plVar5[3];
      local_e8._0_8_ = pcVar2;
    }
    else {
      local_e8._16_8_ = *plVar11;
      local_e8._0_8_ = (long *)*plVar5;
    }
    local_e8._8_8_ = plVar5[1];
    *plVar5 = (long)plVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pNVar6 = StateTestWithBuiltinRules::GetNode
                       ((StateTestWithBuiltinRules *)this,(string *)local_e8);
    pNVar6->dirty_ = true;
    if ((pointer)local_e8._0_8_ != pcVar2) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
    iVar17 = iVar17 + 1;
  } while (iVar17 != 0);
  local_e8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"allTheThings","");
  pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,(string *)local_e8);
  pNVar6->dirty_ = true;
  if ((pointer)local_e8._0_8_ != pcVar2) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  pTVar3 = g_current_test;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_e8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"allTheThings","");
  pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,(string *)local_e8);
  pPVar1 = &(this->super_PlanTest).plan_;
  bVar4 = Plan::AddTarget(pPVar1,pNVar6,&local_110);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
             ,0x11e,"plan_.AddTarget(GetNode(\"allTheThings\"), &err)");
  if ((pointer)local_e8._0_8_ != pcVar2) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  pTVar3 = g_current_test;
  iVar17 = std::__cxx11::string::compare((char *)&local_110);
  bVar4 = testing::Test::Check
                    (pTVar3,iVar17 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                     ,0x11f,"\"\" == err");
  if (!bVar4) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00121591;
  }
  local_a8 = (_Elt_pointer)0x0;
  pppEStack_a0 = (_Map_pointer)0x0;
  local_b8 = (_Elt_pointer)0x0;
  ppEStack_b0 = (_Elt_pointer)0x0;
  local_c8 = (_Elt_pointer)0x0;
  pppEStack_c0 = (_Map_pointer)0x0;
  local_e8._16_8_ = (undefined8 *)0x0;
  local_e8._24_8_ = (undefined8 *)0x0;
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = 0;
  std::_Deque_base<Edge_*,_std::allocator<Edge_*>_>::_M_initialize_map
            ((_Deque_base<Edge_*,_std::allocator<Edge_*>_> *)local_e8,0);
  local_f0 = pPVar1;
  PlanTest::FindWorkSorted
            (&this->super_PlanTest,(deque<Edge_*,_std::allocator<Edge_*>_> *)local_e8,5);
  lVar19 = 0;
  uVar21 = 0;
  do {
    pTVar3 = g_current_test;
    lVar7 = (long)(local_e8._16_8_ - local_e8._24_8_) >> 3;
    uVar15 = uVar21 + lVar7;
    if (uVar15 < 0x40) {
      ppEVar12 = (Edge **)(local_e8._16_8_ + lVar19);
    }
    else {
      uVar16 = uVar15 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar15) {
        uVar16 = uVar15 >> 6;
      }
      ppEVar12 = pppEStack_c0[uVar16] + lVar7 + uVar16 * -0x40 + uVar21;
    }
    pEVar8 = *ppEVar12;
    iVar17 = std::__cxx11::string::compare
                       ((char *)&(*(pEVar8->inputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_start)->env_path_);
    bVar4 = testing::Test::Check
                      (pTVar3,iVar17 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x126,"\"in\" == edge->inputs_[0]->path()");
    if (!bVar4) goto LAB_0012157e;
    pcVar14 = "outb";
    if (uVar21 < 2) {
      pcVar14 = "out";
    }
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,pcVar14,pcVar14 + (4 - (ulong)(uVar21 < 2)));
    pTVar3 = g_current_test;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,(ulong)local_90[0])
    ;
    local_70 = &local_60;
    plVar11 = plVar5 + 2;
    if ((long *)*plVar5 == plVar11) {
      local_60 = *plVar11;
      lStack_58 = plVar5[3];
    }
    else {
      local_60 = *plVar11;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    pNVar6 = *(pEVar8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_68 == (pNVar6->env_path_)._M_string_length) {
      if (local_68 == 0) {
        bVar4 = true;
      }
      else {
        iVar17 = bcmp(local_70,(pNVar6->env_path_)._M_dataplus._M_p,local_68);
        bVar4 = iVar17 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x128,"base_name + string(1, \'1\' + (i % 2)) == edge->outputs_[0]->path()")
    ;
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (!bVar4) {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      goto LAB_00121587;
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    pPVar1 = local_f0;
    uVar21 = uVar21 + 1;
    lVar19 = lVar19 + 8;
  } while (uVar21 != 4);
  lVar19 = (long)(local_e8._16_8_ - local_e8._24_8_) >> 3;
  uVar21 = lVar19 + 4;
  if (uVar21 < 0x40) {
    ppEVar12 = (Edge **)(local_e8._16_8_ + 0x20);
  }
  else {
    uVar15 = uVar21 >> 6 | 0xfc00000000000000;
    if (-4 < lVar19) {
      uVar15 = uVar21 >> 6;
    }
    ppEVar12 = pppEStack_c0[uVar15] + uVar21 + uVar15 * -0x40;
  }
  pEVar8 = *ppEVar12;
  bVar4 = testing::Test::Check
                    (g_current_test,pEVar8 != (Edge *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                     ,0x12d,"edge");
  pTVar3 = g_current_test;
  if (bVar4) {
    iVar17 = std::__cxx11::string::compare
                       ((char *)&(*(pEVar8->inputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_start)->env_path_);
    bVar4 = testing::Test::Check
                      (pTVar3,iVar17 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x12e,"\"in\" == edge->inputs_[0]->path()");
    pTVar3 = g_current_test;
    if (!bVar4) goto LAB_00121583;
    iVar17 = std::__cxx11::string::compare
                       ((char *)&(*(pEVar8->outputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_start)->env_path_);
    bVar4 = testing::Test::Check
                      (pTVar3,iVar17 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x12f,"\"outb3\" == edge->outputs_[0]->path()");
    if (bVar4) {
      Plan::EdgeFinished(pPVar1,*(Edge **)local_e8._16_8_,kEdgeSucceeded,&local_110);
      pTVar3 = g_current_test;
      iVar17 = std::__cxx11::string::compare((char *)&local_110);
      bVar4 = testing::Test::Check
                        (pTVar3,iVar17 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0x133,"\"\" == err");
      if (!bVar4) goto LAB_0012157e;
      if ((_Elt_pointer)local_e8._16_8_ == local_c8 + -1) {
        operator_delete((void *)local_e8._24_8_,0x200);
        local_e8._16_8_ = pppEStack_c0[1];
        local_c8 = (_Elt_pointer)(local_e8._16_8_ + 0x200);
        local_e8._24_8_ = local_e8._16_8_;
        pppEStack_c0 = pppEStack_c0 + 1;
      }
      else {
        local_e8._16_8_ = local_e8._16_8_ + 8;
      }
      pEVar8 = Plan::FindWork(pPVar1);
      bVar4 = testing::Test::Check
                        (g_current_test,pEVar8 != (Edge *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0x138,"out3");
      pTVar3 = g_current_test;
      if (bVar4) {
        iVar17 = std::__cxx11::string::compare
                           ((char *)&(*(pEVar8->inputs_).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start)->env_path_);
        bVar4 = testing::Test::Check
                          (pTVar3,iVar17 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x139,"\"in\" == out3->inputs_[0]->path()");
        pTVar3 = g_current_test;
        if (!bVar4) goto LAB_001215c5;
        iVar17 = std::__cxx11::string::compare
                           ((char *)&(*(pEVar8->outputs_).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start)->env_path_);
        bVar4 = testing::Test::Check
                          (pTVar3,iVar17 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x13a,"\"out3\" == out3->outputs_[0]->path()");
        pTVar3 = g_current_test;
        if (!bVar4) goto LAB_001215c5;
        pEVar9 = Plan::FindWork(pPVar1);
        bVar4 = testing::Test::Check
                          (pTVar3,pEVar9 == (Edge *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x13c,"plan_.FindWork()");
        if (!bVar4) goto LAB_0012157e;
        Plan::EdgeFinished(pPVar1,pEVar8,kEdgeSucceeded,&local_110);
        pTVar3 = g_current_test;
        iVar17 = std::__cxx11::string::compare((char *)&local_110);
        bVar4 = testing::Test::Check
                          (pTVar3,iVar17 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x13f,"\"\" == err");
        pTVar3 = g_current_test;
        if (!bVar4) goto LAB_00121583;
        pEVar8 = Plan::FindWork(pPVar1);
        bVar4 = testing::Test::Check
                          (pTVar3,pEVar8 == (Edge *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x141,"plan_.FindWork()");
        if (!bVar4) goto LAB_0012157e;
        if ((_Elt_pointer)local_e8._16_8_ != local_b8) {
          ppEVar13 = (_Elt_pointer)local_e8._16_8_;
          pppEVar18 = pppEStack_c0;
          ppEVar20 = local_c8;
          do {
            Plan::EdgeFinished(local_f0,*ppEVar13,kEdgeSucceeded,&local_110);
            pTVar3 = g_current_test;
            iVar17 = std::__cxx11::string::compare((char *)&local_110);
            bVar4 = testing::Test::Check
                              (pTVar3,iVar17 == 0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0x145,"\"\" == err");
            if (!bVar4) goto LAB_0012157e;
            ppEVar13 = ppEVar13 + 1;
            if (ppEVar13 == ppEVar20) {
              ppEVar13 = pppEVar18[1];
              pppEVar18 = pppEVar18 + 1;
              ppEVar20 = ppEVar13 + 0x40;
            }
          } while (ppEVar13 != local_b8);
        }
        pEVar8 = Plan::FindWork(local_f0);
        bVar4 = testing::Test::Check
                          (g_current_test,pEVar8 != (Edge *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x149,"last");
        pTVar3 = g_current_test;
        if (!bVar4) goto LAB_001215c5;
        iVar17 = std::__cxx11::string::compare
                           ((char *)&(*(pEVar8->outputs_).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start)->env_path_);
        bVar4 = testing::Test::Check
                          (pTVar3,iVar17 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x14a,"\"allTheThings\" == last->outputs_[0]->path()");
        if (!bVar4) goto LAB_0012157e;
        Plan::EdgeFinished(local_f0,pEVar8,kEdgeSucceeded,&local_110);
        pTVar3 = g_current_test;
        iVar17 = std::__cxx11::string::compare((char *)&local_110);
        bVar4 = testing::Test::Check
                          (pTVar3,iVar17 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x14d,"\"\" == err");
        if (bVar4) {
          bVar4 = testing::Test::Check
                            (g_current_test,
                             (this->super_PlanTest).plan_.command_edges_ < 1 ||
                             (this->super_PlanTest).plan_.wanted_edges_ < 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0x14f,"plan_.more_to_do()");
          pTVar3 = g_current_test;
          if (bVar4) {
            pEVar8 = Plan::FindWork(local_f0);
            bVar4 = testing::Test::Check
                              (pTVar3,pEVar8 == (Edge *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0x150,"plan_.FindWork()");
            if (!bVar4) goto LAB_0012157e;
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
      }
      else {
LAB_001215c5:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
LAB_0012157e:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
LAB_00121583:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
LAB_00121587:
  std::_Deque_base<Edge_*,_std::allocator<Edge_*>_>::~_Deque_base
            ((_Deque_base<Edge_*,_std::allocator<Edge_*>_> *)local_e8);
LAB_00121591:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(PlanTest, PoolsWithDepthTwo) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"pool foobar\n"
"  depth = 2\n"
"pool bazbin\n"
"  depth = 2\n"
"rule foocat\n"
"  command = cat $in > $out\n"
"  pool = foobar\n"
"rule bazcat\n"
"  command = cat $in > $out\n"
"  pool = bazbin\n"
"build out1: foocat in\n"
"build out2: foocat in\n"
"build out3: foocat in\n"
"build outb1: bazcat in\n"
"build outb2: bazcat in\n"
"build outb3: bazcat in\n"
"  pool =\n"
"build allTheThings: cat out1 out2 out3 outb1 outb2 outb3\n"
));
  // Mark all the out* nodes dirty
  for (int i = 0; i < 3; ++i) {
    GetNode("out" + string(1, '1' + static_cast<char>(i)))->MarkDirty();
    GetNode("outb" + string(1, '1' + static_cast<char>(i)))->MarkDirty();
  }
  GetNode("allTheThings")->MarkDirty();

  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("allTheThings"), &err));
  ASSERT_EQ("", err);

  deque<Edge*> edges;
  FindWorkSorted(&edges, 5);

  for (int i = 0; i < 4; ++i) {
    Edge *edge = edges[i];
    ASSERT_EQ("in",  edge->inputs_[0]->path());
    string base_name(i < 2 ? "out" : "outb");
    ASSERT_EQ(base_name + string(1, '1' + (i % 2)), edge->outputs_[0]->path());
  }

  // outb3 is exempt because it has an empty pool
  Edge* edge = edges[4];
  ASSERT_TRUE(edge);
  ASSERT_EQ("in",  edge->inputs_[0]->path());
  ASSERT_EQ("outb3", edge->outputs_[0]->path());

  // finish out1
  plan_.EdgeFinished(edges.front(), Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);
  edges.pop_front();

  // out3 should be available
  Edge* out3 = plan_.FindWork();
  ASSERT_TRUE(out3);
  ASSERT_EQ("in",  out3->inputs_[0]->path());
  ASSERT_EQ("out3", out3->outputs_[0]->path());

  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(out3, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.FindWork());

  for (deque<Edge*>::iterator it = edges.begin(); it != edges.end(); ++it) {
    plan_.EdgeFinished(*it, Plan::kEdgeSucceeded, &err);
    ASSERT_EQ("", err);
  }

  Edge* last = plan_.FindWork();
  ASSERT_TRUE(last);
  ASSERT_EQ("allTheThings", last->outputs_[0]->path());

  plan_.EdgeFinished(last, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.more_to_do());
  ASSERT_FALSE(plan_.FindWork());
}